

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsplit.hpp
# Opt level: O0

void __thiscall
ncursespp::
vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
::resize_impl<0ul,1ul,2ul>
          (vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
           *this,point<int> param_2,point<int> param_3)

{
  __tuple_element_t<0UL,_tuple<fixed_impl<20,_hsplit<fixed_impl<15,_item_list<empty_item>_>,_fill_impl<color_rect>_>_>,_fixed_impl<1,_color_rect>,_fill_impl<text>_>_>
  *p_Var1;
  __tuple_element_t<1UL,_tuple<fixed_impl<20,_hsplit<fixed_impl<15,_item_list<empty_item>_>,_fill_impl<color_rect>_>_>,_fixed_impl<1,_color_rect>,_fill_impl<text>_>_>
  *p_Var2;
  __tuple_element_t<2UL,_tuple<fixed_impl<20,_hsplit<fixed_impl<15,_item_list<empty_item>_>,_fill_impl<color_rect>_>_>,_fixed_impl<1,_color_rect>,_fill_impl<text>_>_>
  *p_Var3;
  int *local_88;
  anon_class_40_5_85981cb9 apply_resize;
  int *piStack_58;
  int xpos;
  anon_class_24_3_3cf6bd8b apply_calc;
  int local_38;
  int space;
  int idx;
  array<int,_3UL> widths;
  vsplit<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
  *this_local;
  undefined1 local_18 [8];
  rect_i size_local;
  
  widths._M_elems._4_8_ = this;
  local_18 = (undefined1  [8])param_2;
  size_local.left_top = param_3;
  memset(&space,0,0xc);
  local_38 = 0;
  apply_calc.space._4_4_ = rect<int>::width((rect<int> *)local_18);
  piStack_58 = &space;
  apply_calc.widths = (array<int,_3UL> *)&stack0xffffffffffffffc8;
  apply_calc.idx = (int *)((long)&apply_calc.space + 4);
  p_Var1 = std::
           get<0ul,ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
                     ((tuple<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
                       *)this);
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&stack0xffffffffffffffa8,p_Var1);
  p_Var2 = std::
           get<1ul,ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
                     ((tuple<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
                       *)this);
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&stack0xffffffffffffffa8,p_Var2);
  p_Var3 = std::
           get<2ul,ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
                     ((tuple<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
                       *)this);
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&stack0xffffffffffffffa8,p_Var3);
  local_38 = 0;
  apply_resize.size._4_4_ = 0;
  local_88 = &space;
  apply_resize.widths = (array<int,_3UL> *)&stack0xffffffffffffffc8;
  apply_resize.idx = (int *)((long)&apply_calc.space + 4);
  apply_resize.space = (int *)((long)&apply_resize.size + 4);
  apply_resize.xpos = (int *)local_18;
  p_Var1 = std::
           get<0ul,ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
                     ((tuple<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
                       *)this);
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#2}::operator()((_lambda_auto_1___2_ *)&local_88,p_Var1);
  p_Var2 = std::
           get<1ul,ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
                     ((tuple<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
                       *)this);
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#2}::operator()((_lambda_auto_1___2_ *)&local_88,p_Var2);
  p_Var3 = std::
           get<2ul,ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
                     ((tuple<ncursespp::constraint::fixed_impl<20,_ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,_ncursespp::item_list<empty_item>_>,_ncursespp::constraint::fill_impl<ncursespp::color_rect>_>_>,_ncursespp::constraint::fixed_impl<1,_ncursespp::color_rect>,_ncursespp::constraint::fill_impl<ncursespp::text>_>
                       *)this);
  resize_impl<0ul,1ul,2ul>(ncursespp::rect<int>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)::
  {lambda(auto:1&)#2}::operator()((_lambda_auto_1___2_ *)&local_88,p_Var3);
  return;
}

Assistant:

void resize_impl(rect_i size, std::index_sequence<I...>)
    {
        std::array<int, count> widths {};
        int idx = 0;
        auto space = size.width();

        // query size_calculator<>::calc for every constraint_t in Splits
        // calc will decrement space when the size is known
        auto apply_calc = [&](auto& S) {
            using SplitType = std::decay_t<decltype(S)>;
            widths[idx] = SplitType::calc(space);
            idx ++;
        };

        (apply_calc(std::get<I>(splits)), ...);

        idx = 0;
        int xpos = 0;
        auto apply_resize = [&](auto& S) {
            if (widths[idx] == -1 && space > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + space, size.right_bottom.y}};
                xpos += space;
                space = 0;
                S.resize(r);
            } else if (widths[idx] > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + widths[idx] - 1, size.right_bottom.y}};
                xpos += widths[idx];
                S.resize(r);
            }

            idx ++;
        };

        (apply_resize(std::get<I>(splits)), ...);
    }